

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TableauPileCollider.cpp
# Opt level: O0

Position __thiscall
solitaire::colliders::TableauPileCollider::getLastCardOrPilePosition(TableauPileCollider *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  size_type sVar3;
  undefined4 extraout_var_00;
  Cards *cards;
  TableauPileCollider *this_local;
  
  iVar2 = (*(this->tableauPile->super_Archiver)._vptr_Archiver[7])();
  bVar1 = std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::empty
                    ((vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
                     CONCAT44(extraout_var,iVar2));
  if (bVar1) {
    this_local = *(TableauPileCollider **)&this->position;
  }
  else {
    sVar3 = std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::size
                      ((vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
                       CONCAT44(extraout_var,iVar2));
    iVar2 = (*(this->super_TableauPileCollider)._vptr_TableauPileCollider[4])
                      (this,(ulong)((int)sVar3 - 1));
    this_local = (TableauPileCollider *)CONCAT44(extraout_var_00,iVar2);
  }
  return (Position)this_local;
}

Assistant:

Position TableauPileCollider::getLastCardOrPilePosition() const {
    const auto& cards = tableauPile.getCards();
    if (cards.empty())
        return position;
    return getCardPosition(cards.size() - 1);
}